

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  bool bVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  
  pcVar2 = (cJSON *)&array->child;
  pcVar3 = pcVar2;
  do {
    pcVar3 = pcVar3->next;
    if (pcVar3 == (cJSON *)0x0) break;
    bVar1 = 0 < which;
    which = which + -1;
  } while (bVar1);
  if (pcVar3 != (cJSON *)0x0) {
    newitem->next = pcVar3;
    newitem->prev = pcVar3->prev;
    pcVar3->prev = newitem;
    if (pcVar3 != *(cJSON **)pcVar2) {
      pcVar2 = newitem->prev;
    }
    pcVar2->next = newitem;
    return;
  }
  cJSON_AddItemToArray(array,newitem);
  return;
}

Assistant:

void   cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)		{cJSON *c=array->child;while (c && which>0) c=c->next,which--;if (!c) {cJSON_AddItemToArray(array,newitem);return;}
	newitem->next=c;newitem->prev=c->prev;c->prev=newitem;if (c==array->child) array->child=newitem; else newitem->prev->next=newitem;}